

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Journal.h
# Opt level: O2

void __thiscall
beast::Journal::ScopedStream::ScopedStream<std::__cxx11::string>
          (ScopedStream *this,Stream *stream,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  ScopedStream(this,stream->m_sink,stream->m_level);
  std::operator<<((ostream *)&this->m_ostream,(string *)t);
  return;
}

Assistant:

Journal::ScopedStream::ScopedStream (Journal::Stream const& stream, T const& t)
   : ScopedStream (stream.sink(), stream.level())
{
    m_ostream << t;
}